

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::update_peer_dscp(session_impl *this)

{
  bool bVar1;
  unsigned_short uVar2;
  uint v;
  uint uVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  string local_180;
  endpoint local_15c;
  address local_140;
  string local_120;
  undefined1 local_100 [8];
  error_code ec_1;
  endpoint_type local_c0;
  endpoint_type local_a4;
  address local_88;
  string local_68;
  undefined1 local_48 [8];
  error_code ec;
  shared_ptr<libtorrent::aux::listen_socket_t> *l;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  *__range2;
  int value;
  session_impl *this_local;
  
  v = session_settings::get_int(&this->m_settings,0x4028);
  __end2 = ::std::
           vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ::begin(&this->m_listen_sockets);
  l = (shared_ptr<libtorrent::aux::listen_socket_t> *)
      ::std::
      vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
      ::end(&this->m_listen_sockets);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                     *)&l), bVar1) {
    ec.cat_ = (error_category *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
              ::operator*(&__end2);
    peVar4 = ::std::
             __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)ec.cat_);
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar4->sock);
    if (bVar1) {
      boost::system::error_code::error_code((error_code *)local_48);
      peVar4 = ::std::
               __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)ec.cat_);
      peVar5 = ::std::
               __shared_ptr_access<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&peVar4->sock);
      set_traffic_class<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                (peVar5,v,(error_code *)local_48);
      bVar1 = should_log(this);
      if (bVar1) {
        peVar4 = ::std::
                 __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)ec.cat_);
        peVar5 = ::std::
                 __shared_ptr_access<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar4->sock);
        boost::asio::
        basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        ::local_endpoint(&local_a4,peVar5);
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address(&local_88,&local_a4);
        boost::asio::ip::address::to_string_abi_cxx11_(&local_68,&local_88);
        uVar7 = ::std::__cxx11::string::c_str();
        peVar4 = ::std::
                 __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)ec.cat_);
        peVar5 = ::std::
                 __shared_ptr_access<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar4->sock);
        boost::asio::
        basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        ::local_endpoint(&local_c0,peVar5);
        uVar2 = boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port(&local_c0);
        boost::system::error_code::message_abi_cxx11_((string *)&ec_1.cat_,(error_code *)local_48);
        uVar8 = ::std::__cxx11::string::c_str();
        session_log(this,">>> SET_DSCP [ tcp (%s %d) value: %x e: %s ]",uVar7,(ulong)uVar2,(ulong)v,
                    uVar8);
        ::std::__cxx11::string::~string((string *)&ec_1.cat_);
        ::std::__cxx11::string::~string((string *)&local_68);
      }
    }
    peVar4 = ::std::
             __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)ec.cat_);
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar4->udp_sock);
    if (bVar1) {
      boost::system::error_code::error_code((error_code *)local_100);
      peVar4 = ::std::
               __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)ec.cat_);
      peVar6 = ::std::
               __shared_ptr_access<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar4->udp_sock);
      set_traffic_class<libtorrent::aux::udp_socket>(&peVar6->sock,v,(error_code *)local_100);
      bVar1 = should_log(this);
      if (bVar1) {
        peVar4 = ::std::
                 __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)ec.cat_);
        peVar6 = ::std::
                 __shared_ptr_access<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar4->udp_sock);
        udp_socket::local_endpoint(&local_15c,&peVar6->sock);
        boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::address(&local_140,&local_15c);
        boost::asio::ip::address::to_string_abi_cxx11_(&local_120,&local_140);
        uVar7 = ::std::__cxx11::string::c_str();
        peVar4 = ::std::
                 __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)ec.cat_);
        peVar6 = ::std::
                 __shared_ptr_access<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar4->udp_sock);
        uVar3 = udp_socket::local_port(&peVar6->sock);
        boost::system::error_code::message_abi_cxx11_(&local_180,(error_code *)local_100);
        uVar8 = ::std::__cxx11::string::c_str();
        session_log(this,">>> SET_DSCP [ udp (%s %d) value: %x e: %s ]",uVar7,(ulong)uVar3,(ulong)v,
                    uVar8);
        ::std::__cxx11::string::~string((string *)&local_180);
        ::std::__cxx11::string::~string((string *)&local_120);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void session_impl::update_peer_dscp()
	{
		int const value = m_settings.get_int(settings_pack::peer_dscp);
		for (auto const& l : m_listen_sockets)
		{
			if (l->sock)
			{
				error_code ec;
				set_traffic_class(*l->sock, value, ec);

#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					session_log(">>> SET_DSCP [ tcp (%s %d) value: %x e: %s ]"
						, l->sock->local_endpoint().address().to_string().c_str()
						, l->sock->local_endpoint().port(), value, ec.message().c_str());
				}
#endif
			}

			if (l->udp_sock)
			{
				error_code ec;
				set_traffic_class(l->udp_sock->sock, value, ec);

#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					session_log(">>> SET_DSCP [ udp (%s %d) value: %x e: %s ]"
						, l->udp_sock->sock.local_endpoint().address().to_string().c_str()
						, l->udp_sock->sock.local_port()
						, value, ec.message().c_str());
				}
#endif
			}
		}
	}